

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O1

bool slang::analysis::hasUnusedAttrib(Compilation *compilation,Symbol *symbol)

{
  AttributeSymbol *this;
  size_t sVar1;
  char *__s1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ConstantValue *this_00;
  long lVar5;
  size_type __rlen;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar6;
  uint local_3c;
  
  sVar6 = ast::Compilation::getAttributes(compilation,symbol);
  if (sVar6._M_extent._M_extent_value._M_extent_value != 0) {
    lVar5 = 0;
    local_3c = (uint)sVar6._M_ptr;
    do {
      this = *(AttributeSymbol **)((long)sVar6._M_ptr + lVar5);
      sVar1 = (this->super_Symbol).name._M_len;
      __s1 = (this->super_Symbol).name._M_str;
      bVar2 = true;
      if (sVar1 == 0xc) {
        iVar4 = bcmp(__s1,"maybe_unused",0xc);
joined_r0x00380481:
        if (iVar4 == 0) {
          this_00 = ast::AttributeSymbol::getValue(this);
          bVar2 = ConstantValue::isTrue(this_00);
          local_3c = (uint)bVar2;
          bVar2 = false;
        }
      }
      else if (sVar1 == 6) {
        iVar4 = bcmp(__s1,"unused",6);
        goto joined_r0x00380481;
      }
      if (!bVar2) {
        bVar3 = (byte)local_3c;
        goto LAB_003804ae;
      }
      lVar5 = lVar5 + 8;
    } while (sVar6._M_extent._M_extent_value._M_extent_value << 3 != lVar5);
  }
  bVar3 = 0;
LAB_003804ae:
  return (bool)(bVar3 & 1);
}

Assistant:

static bool hasUnusedAttrib(const Compilation& compilation, const Symbol& symbol) {
    for (auto attr : compilation.getAttributes(symbol)) {
        if (attr->name == "unused"sv || attr->name == "maybe_unused"sv)
            return attr->getValue().isTrue();
    }
    return false;
}